

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::null_scoped_padder>::format_mdc
          (mdc_formatter<spdlog::details::null_scoped_padder> *this,mdc_map_t *mdc_map,
          memory_buf_t *dest)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  char *buf_ptr_1;
  
  p_Var1 = &(mdc_map->_M_t)._M_impl.super__Rb_tree_header;
  p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(&p_Var1->_M_header);
  for (p_Var3 = (mdc_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    ::fmt::v11::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,*(char **)(p_Var3 + 1),
               *(char **)(p_Var3 + 1) + (long)&(p_Var3[1]._M_parent)->_M_color);
    ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,":","");
    ::fmt::v11::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,*(char **)(p_Var3 + 2),
               *(char **)(p_Var3 + 2) + (long)&(p_Var3[2]._M_parent)->_M_color);
    if (p_Var3 != p_Var2) {
      ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>," ","");
    }
  }
  return;
}

Assistant:

void format_mdc(const mdc::mdc_map_t &mdc_map, memory_buf_t &dest) {
        auto last_element = --mdc_map.end();
        for (auto it = mdc_map.begin(); it != mdc_map.end(); ++it) {
            auto &pair = *it;
            const auto &key = pair.first;
            const auto &value = pair.second;
            size_t content_size = key.size() + value.size() + 1;  // 1 for ':'

            if (it != last_element) {
                content_size++;  // 1 for ' '
            }

            ScopedPadder p(content_size, padinfo_, dest);
            fmt_helper::append_string_view(key, dest);
            fmt_helper::append_string_view(":", dest);
            fmt_helper::append_string_view(value, dest);
            if (it != last_element) {
                fmt_helper::append_string_view(" ", dest);
            }
        }
    }